

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  
  puVar1 = (undefined8 *)pAbc->pAbcPla;
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar6 = Extra_UtilGetopt(argc,argv,"madvh"), iVar6 == 0x76) {
          bVar3 = (bool)(bVar3 ^ 1);
        }
        if (99 < iVar6) break;
        if (iVar6 == -1) {
          if (puVar1 == (undefined8 *)0x0) {
            Abc_Print(1,"Abc_CommandPs(): There is no current design.\n");
            return 0;
          }
          uVar8 = 0;
          printf("%-16s :  ",*puVar1);
          printf("In =%4d  ",(ulong)*(uint *)((long)puVar1 + 0x14));
          printf("Out =%4d  ",(ulong)*(uint *)(puVar1 + 3));
          printf("Cube =%8d  ",(ulong)*(uint *)((long)puVar1 + 0x2c));
          if ((long)*(int *)((long)puVar1 + 0x2c) < 1) goto LAB_003fd3ff;
          lVar10 = 0;
          goto LAB_003fd399;
        }
        if (iVar6 != 0x61) goto LAB_003fd269;
        bVar4 = (bool)(bVar4 ^ 1);
      }
      if (iVar6 != 100) break;
      bVar5 = (bool)(bVar5 ^ 1);
    }
    if (iVar6 != 0x6d) break;
    bVar2 = (bool)(bVar2 ^ 1);
  }
LAB_003fd269:
  Abc_Print(-2,"usage: |ps [-madvh]\n");
  Abc_Print(-2,"\t         prints statistics\n");
  pcVar9 = "yes";
  pcVar7 = "yes";
  if (!bVar2) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-m     : toggle printing multipliers [default = %s]\n",pcVar7);
  pcVar7 = "yes";
  if (!bVar4) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle printing adders [default = %s]\n",pcVar7);
  pcVar7 = "yes";
  if (!bVar5) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle printing distrubition [default = %s]\n",pcVar7);
  if (!bVar3) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar9);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
  while( true ) {
    if (0 < *(int *)((long)puVar1 + 0x14)) {
      iVar6 = 0;
      do {
        iVar6 = iVar6 + 1;
      } while (*(int *)((long)puVar1 + 0x14) != iVar6);
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == *(int *)((long)puVar1 + 0x2c)) break;
LAB_003fd399:
    lVar11 = lVar10 * *(int *)((long)puVar1 + 0x1c);
    if ((lVar11 < 0) || (*(int *)((long)puVar1 + 0x4c) <= lVar11)) goto LAB_003fd4e1;
  }
LAB_003fd3ff:
  printf("LitIn =%8d  ");
  if (0 < (long)*(int *)((long)puVar1 + 0x2c)) {
    lVar10 = 0;
    uVar8 = 0;
    do {
      lVar11 = lVar10 * *(int *)(puVar1 + 4);
      if ((lVar11 < 0) || (*(int *)((long)puVar1 + 0x5c) <= lVar11)) {
LAB_003fd4e1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if (0 < (int)*(uint *)(puVar1 + 3)) {
        bVar12 = 0;
        uVar14 = 0;
        do {
          uVar8 = uVar8 + (((uint)(*(ulong *)(lVar11 * 8 + puVar1[0xc] + (uVar14 >> 5) * 8) >>
                                  (bVar12 & 0x3e)) & 3) == 2);
          uVar13 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar13;
          bVar12 = bVar12 + 2;
        } while (*(uint *)(puVar1 + 3) != uVar13);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != *(int *)((long)puVar1 + 0x2c));
  }
  printf("LitOut =%8d  ",(ulong)uVar8);
  printf("Div =%6d  ",(ulong)*(uint *)((long)puVar1 + 0x8c));
  putchar(10);
  return 0;
}

Assistant:

int Abc_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int fShowCones   = 0;
    int fShowMulti   = 0;
    int fShowAdder   = 0;
    int fShowMem     = 0;
    int fDistrib     = 0;
    int fTwoSides    = 0;
    int fAllObjects  = 0;
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cbamdtovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fShowCones ^= 1;
            break;
        case 'b':
            fShowMulti ^= 1;
            break;
        case 'a':
            fShowAdder ^= 1;
            break;
        case 'm':
            fShowMem ^= 1;
            break;
        case 'd':
            fDistrib ^= 1;
            break;
        case 't':
            fTwoSides ^= 1;
            break;
        case 'o':
            fAllObjects ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkPrintStats( pNtk, fDistrib, fTwoSides, fVerbose );
    if ( fShowCones )
        Wlc_NtkProfileCones( pNtk ); 
    if ( fShowMulti )
        Wlc_NtkPrintNodes( pNtk, WLC_OBJ_ARI_MULTI );
    if ( fShowAdder )
        Wlc_NtkPrintNodes( pNtk, WLC_OBJ_ARI_ADD );
    if ( fShowMem )
        Wlc_NtkPrintMemory( pNtk );
    if ( fAllObjects )
        Wlc_NtkPrintObjects( pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%ps [-cbamdtovh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-c     : toggle printing cones [default = %s]\n",                 fShowCones? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle printing multipliers [default = %s]\n",           fShowMulti? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle printing adders [default = %s]\n",                fShowAdder? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle printing memories [default = %s]\n",              fShowMem?   "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing distrubition [default = %s]\n",          fDistrib?   "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle printing stats for LHS and RHS [default = %s]\n", fTwoSides?  "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle printing all objects [default = %s]\n",           fAllObjects?"yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",   fVerbose?   "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}